

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * ApprovalTests::StringUtils::replaceAll(string *inText,string *find,string *replaceWith)

{
  ulong uVar1;
  string *psVar2;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t start_pos;
  
  while( true ) {
    uVar1 = ::std::__cxx11::string::find(in_RSI,in_RDX);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)::std::__cxx11::string::length();
    ::std::__cxx11::string::replace((ulong)in_RSI,uVar1,psVar2);
    ::std::__cxx11::string::length();
  }
  ::std::__cxx11::string::string(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::replaceAll(std::string inText,
                                        const std::string& find,
                                        const std::string& replaceWith)
    {
        size_t start_pos = 0;
        while ((start_pos = inText.find(find, start_pos)) != std::string::npos)
        {
            inText.replace(start_pos, find.length(), replaceWith);
            start_pos +=
                replaceWith.length(); // Handles case where 'to' is a substring of 'from'
        }
        return inText;
    }